

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O3

Signedness __thiscall
spvtools::opt::anon_unknown_15::IsGreaterThanZero::Visit(IsGreaterThanZero *this,SENode *node)

{
  long lVar1;
  IRContext *pIVar2;
  TypeManager *this_00;
  int iVar3;
  Signedness SVar4;
  Signedness SVar5;
  uint32_t id;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  code *pcVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Instruction *this_01;
  Type *pTVar7;
  undefined4 extraout_var_03;
  _Any_data *p_Var8;
  Signedness local_70;
  Signedness local_6c;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  iVar3 = (**node->_vptr_SENode)(node);
  SVar5 = kPositiveOrNegative;
  switch(iVar3) {
  case 0:
    iVar3 = (*node->_vptr_SENode[5])(node);
    lVar1 = *(long *)(CONCAT44(extraout_var,iVar3) + 0x30);
    SVar5 = kPositive;
    if (lVar1 != 0) {
      SVar5 = (0 < lVar1) + 1 + (uint)(0 < lVar1);
    }
    break;
  case 1:
    iVar3 = (*node->_vptr_SENode[7])(node);
    local_6c = Visit(this,*(SENode **)(CONCAT44(extraout_var_01,iVar3) + 0x30));
    if (local_6c == kStrictlyPositive) {
      local_6c = kPositive;
    }
    else if (local_6c == kStrictlyNegative) {
      local_6c = kNegative;
    }
    local_70 = Visit(this,*(SENode **)(CONCAT44(extraout_var_01,iVar3) + 0x38));
    SVar5 = std::
            _Function_handler<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp:707:12)>
            ::_M_invoke((_Any_data *)this,&local_6c,&local_70);
    break;
  case 2:
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp:707:12)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp:707:12)>
               ::_M_manager;
    SVar5 = VisitExpr(this,node,
                      (function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
                       *)&local_48);
    if (local_38 == (code *)0x0) {
      return SVar5;
    }
    p_Var8 = &local_48;
    pcVar6 = local_38;
    goto LAB_005c6065;
  case 3:
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_50 = std::
               _Function_handler<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp:743:12)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp:743:12)>
               ::_M_manager;
    SVar5 = VisitExpr(this,node,
                      (function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
                       *)&local_68);
    if (local_58 == (code *)0x0) {
      return SVar5;
    }
    p_Var8 = &local_68;
    pcVar6 = local_58;
LAB_005c6065:
    (*pcVar6)(p_Var8,p_Var8,__destroy_functor);
    break;
  case 4:
    iVar3 = (*node->_vptr_SENode[0xd])(node);
    SVar4 = Visit(this,(SENode *)**(undefined8 **)(CONCAT44(extraout_var_00,iVar3) + 8));
    SVar5 = kPositiveOrNegative;
    if (SVar4 - kStrictlyNegative < 4) {
      SVar5 = *(Signedness *)(&DAT_008d2430 + (ulong)(SVar4 - kStrictlyNegative) * 4);
    }
    break;
  case 5:
    iVar3 = (*node->_vptr_SENode[0xf])(node);
    pIVar2 = this->context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    this_01 = analysis::DefUseManager::GetDef
                        ((pIVar2->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,*(uint32_t *)(CONCAT44(extraout_var_02,iVar3) + 0x2c));
    pIVar2 = this->context_;
    if ((pIVar2->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(pIVar2);
    }
    this_00 = (pIVar2->type_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
    id = 0;
    if (this_01->has_type_id_ == true) {
      id = Instruction::GetSingleWordOperand(this_01,0);
    }
    pTVar7 = analysis::TypeManager::GetType(this_00,id);
    if (pTVar7 == (Type *)0x0) {
      __assert_fail("type && \"Can\'t retrieve a type for the instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                    ,0x34e,
                    "Signedness spvtools::opt::(anonymous namespace)::IsGreaterThanZero::Visit(const SEValueUnknown *)"
                   );
    }
    iVar3 = (*pTVar7->_vptr_Type[9])(pTVar7);
    SVar5 = (*(byte *)(CONCAT44(extraout_var_03,iVar3) + 0x28) ^ 1) << 2;
    break;
  case 6:
    (*node->_vptr_SENode[0x11])(node);
    SVar5 = kPositiveOrNegative;
  }
  return SVar5;
}

Assistant:

Signedness Visit(const SENode* node) {
    switch (node->GetType()) {
      case SENode::Constant:
        return Visit(node->AsSEConstantNode());
        break;
      case SENode::RecurrentAddExpr:
        return Visit(node->AsSERecurrentNode());
        break;
      case SENode::Negative:
        return Visit(node->AsSENegative());
        break;
      case SENode::CanNotCompute:
        return Visit(node->AsSECantCompute());
        break;
      case SENode::ValueUnknown:
        return Visit(node->AsSEValueUnknown());
        break;
      case SENode::Add:
        return VisitExpr(node, GetAddCombiner());
        break;
      case SENode::Multiply:
        return VisitExpr(node, GetMulCombiner());
        break;
    }
    return Signedness::kPositiveOrNegative;
  }